

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001890b0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001890b7._0_1_ = '.';
    uRam00000000001890b7._1_1_ = '.';
    uRam00000000001890b7._2_1_ = '.';
    uRam00000000001890b7._3_1_ = '.';
    uRam00000000001890b7._4_1_ = '.';
    uRam00000000001890b7._5_1_ = '.';
    uRam00000000001890b7._6_1_ = '.';
    uRam00000000001890b7._7_1_ = '.';
    DAT_001890a0 = '.';
    DAT_001890a0_1._0_1_ = '.';
    DAT_001890a0_1._1_1_ = '.';
    DAT_001890a0_1._2_1_ = '.';
    DAT_001890a0_1._3_1_ = '.';
    DAT_001890a0_1._4_1_ = '.';
    DAT_001890a0_1._5_1_ = '.';
    DAT_001890a0_1._6_1_ = '.';
    uRam00000000001890a8 = 0x2e2e2e2e2e2e2e;
    DAT_001890af = 0x2e;
    DAT_00189090 = '.';
    DAT_00189090_1._0_1_ = '.';
    DAT_00189090_1._1_1_ = '.';
    DAT_00189090_1._2_1_ = '.';
    DAT_00189090_1._3_1_ = '.';
    DAT_00189090_1._4_1_ = '.';
    DAT_00189090_1._5_1_ = '.';
    DAT_00189090_1._6_1_ = '.';
    uRam0000000000189098._0_1_ = '.';
    uRam0000000000189098._1_1_ = '.';
    uRam0000000000189098._2_1_ = '.';
    uRam0000000000189098._3_1_ = '.';
    uRam0000000000189098._4_1_ = '.';
    uRam0000000000189098._5_1_ = '.';
    uRam0000000000189098._6_1_ = '.';
    uRam0000000000189098._7_1_ = '.';
    DAT_00189080 = '.';
    DAT_00189080_1._0_1_ = '.';
    DAT_00189080_1._1_1_ = '.';
    DAT_00189080_1._2_1_ = '.';
    DAT_00189080_1._3_1_ = '.';
    DAT_00189080_1._4_1_ = '.';
    DAT_00189080_1._5_1_ = '.';
    DAT_00189080_1._6_1_ = '.';
    uRam0000000000189088._0_1_ = '.';
    uRam0000000000189088._1_1_ = '.';
    uRam0000000000189088._2_1_ = '.';
    uRam0000000000189088._3_1_ = '.';
    uRam0000000000189088._4_1_ = '.';
    uRam0000000000189088._5_1_ = '.';
    uRam0000000000189088._6_1_ = '.';
    uRam0000000000189088._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000189078._0_1_ = '.';
    uRam0000000000189078._1_1_ = '.';
    uRam0000000000189078._2_1_ = '.';
    uRam0000000000189078._3_1_ = '.';
    uRam0000000000189078._4_1_ = '.';
    uRam0000000000189078._5_1_ = '.';
    uRam0000000000189078._6_1_ = '.';
    uRam0000000000189078._7_1_ = '.';
    DAT_001890bf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}